

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall LLVMBC::ModuleParseContext::add_type(ModuleParseContext *this,Type *type)

{
  Type *local_18;
  Type *type_local;
  ModuleParseContext *this_local;
  
  local_18 = type;
  type_local = (Type *)this;
  std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
            (&this->types,&local_18);
  return true;
}

Assistant:

bool ModuleParseContext::add_type(Type *type)
{
	types.push_back(type);
	return true;
}